

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O2

void csrTest(int dim)

{
  Matrix *pMVar1;
  Matrix *this;
  Matrix *pMVar2;
  CSR *this_00;
  CSR *this_01;
  TriangularSolve *pTVar3;
  ostream *poVar4;
  allocator local_b9;
  Matrix *local_b8;
  TriangularSolve *local_b0;
  Matrix *local_a8;
  Matrix *local_a0;
  Matrix *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  pMVar1 = (Matrix *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_50,"Lower Triangular",&local_b9);
  Matrix::Matrix(pMVar1,dim,dim,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Matrix::Random(pMVar1);
  Matrix::LowerTriangular(pMVar1);
  this = (Matrix *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_70,"rhs",&local_b9);
  Matrix::Matrix(this,dim,1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  Matrix::Random(this);
  pMVar2 = (Matrix *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_90,"Sparse Matrix:",&local_b9);
  Matrix::Matrix(pMVar2,dim,dim,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  Matrix::Random(pMVar2,dim);
  this_00 = (CSR *)operator_new(0x30);
  local_98 = pMVar2;
  CSR::CSR(this_00,pMVar2);
  CSR::triplet(this_00);
  local_a8 = CSR::turnToRegular(this_00);
  local_a0 = CSR::csrMult(this_00);
  this_01 = (CSR *)operator_new(0x30);
  CSR::CSR(this_01,pMVar1);
  pTVar3 = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(pTVar3,dim);
  local_b0 = pTVar3;
  pMVar2 = TriangularSolve::solve(pTVar3,this_01,this);
  Matrix::print(pMVar2);
  local_b8 = CSR::csrMult(this_01,pMVar2);
  Matrix::isequal(local_b8,this);
  poVar4 = std::operator<<((ostream *)&std::cout,"the result of Triangular solve is: ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::operator<<(poVar4,"\n");
  Matrix::~Matrix(pMVar1);
  operator_delete(pMVar1,0x30);
  Matrix::~Matrix(this);
  operator_delete(this,0x30);
  pMVar1 = local_98;
  Matrix::~Matrix(local_98);
  operator_delete(pMVar1,0x30);
  CSR::~CSR(this_00);
  operator_delete(this_00,0x30);
  pMVar1 = local_a8;
  if (local_a8 != (Matrix *)0x0) {
    Matrix::~Matrix(local_a8);
  }
  operator_delete(pMVar1,0x30);
  pMVar1 = local_a0;
  if (local_a0 != (Matrix *)0x0) {
    Matrix::~Matrix(local_a0);
  }
  operator_delete(pMVar1,0x30);
  CSR::~CSR(this_01);
  operator_delete(this_01,0x30);
  pTVar3 = local_b0;
  TriangularSolve::~TriangularSolve(local_b0);
  operator_delete(pTVar3,4);
  pMVar1 = local_b8;
  Matrix::~Matrix(local_b8);
  operator_delete(pMVar1,0x30);
  Matrix::~Matrix(pMVar2);
  operator_delete(pMVar2,0x30);
  return;
}

Assistant:

void  csrTest(int dim)
{
    Matrix *mtxL = new Matrix(dim,dim,"Lower Triangular");
    mtxL->Random();
    mtxL->LowerTriangular();

    Matrix *rhs = new Matrix(dim, 1, "rhs");
    rhs->Random();

    //CSR print & mult
    Matrix *spr = new Matrix(dim,dim, "Sparse Matrix:");
    spr->Random(dim);
    //   spr->print();
    //save matrix in csr format
    CSR *c1 = new CSR(spr);
    c1->triplet();
    Matrix *reg =  c1->turnToRegular();
    //  reg->print();

    Matrix *vector = c1->csrMult();
    // vector->print();

    //csrSolve
    //  mtxL->print();
    //  rhs->print();
    CSR *c2 = new CSR(mtxL);
    TriangularSolve *rs = new TriangularSolve(dim);
    Matrix *result = rs->solve(c2,rhs);
    result->print();

    //csr Solve,Test the equation(c2*y=rhs)
    Matrix *rs3 = c2->csrMult(result);
    //   rs3->print();
    bool r2 = rs3->isequal(rhs);
    cout<<"the result of Triangular solve is: "<<r2 <<"\n";

    delete mtxL;
    delete rhs;
    delete spr;
    delete c1;
    delete reg;
    delete vector;
    delete c2;
    delete rs;
    delete rs3;
    delete result;
}